

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
::HashElement::operator()
          (HashElement *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          piecewise_construct_t *param_2,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *param_3,tuple<const_phmap::priv::Tracked<int>_&> *param_4)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  uVar2 = std::_Hash_bytes((key->_M_dataplus)._M_p,key->_M_string_length,0xc70f6907);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0) +
         SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8);
}

Assistant:

size_t operator()(const K& key, Args&&...) const {
#if PHMAP_DISABLE_MIX
            return h(key);
#else
            return phmap_mix<sizeof(size_t)>()(h(key));
#endif
        }